

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RoboSimian::RoboSimian
          (RoboSimian *this,ChSystem *system,bool has_sled,bool fixed)

{
  undefined8 uVar1;
  int iVar2;
  ContactManager *this_00;
  ContactMaterial *this_01;
  void *this_02;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  allocator local_42;
  allocator local_41;
  string *local_40;
  string *local_38;
  
  this->m_system = system;
  this->m_owns_system = false;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5 = ZEXT464(0) << 0x40;
  this->m_wheel_mode = SPEED;
  this->m_chassis_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._0_16_;
  this->m_sled_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._16_16_;
  this->m_wheel_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._32_16_;
  this->m_link_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._48_16_;
  this->m_sled_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._0_16_;
  this->m_wheel_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._16_16_;
  this->m_link_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._32_16_;
  this->m_wheelDD_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._48_16_;
  auVar4._8_4_ = 0x3f4ccccd;
  auVar4._0_8_ = 0x3f4ccccd3f4ccccd;
  auVar4._12_4_ = 0x3f4ccccd;
  uVar1 = vmovlps_avx(auVar4);
  this->m_wheel_friction = (float)(int)uVar1;
  this->m_sled_friction = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_driver).super___shared_ptr<chrono::robosimian::RS_Driver,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_driver).super___shared_ptr<chrono::robosimian::RS_Driver,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (ContactManager *)operator_new(0x10);
  ContactManager::ContactManager(this_00);
  this->m_contact_reporter = this_00;
  this->m_material_override = (ContactMaterial *)0x0;
  std::__cxx11::string::string((string *)&this->m_outdir,"",&local_41);
  local_40 = &this->m_root;
  local_38 = &this->m_outdir;
  std::__cxx11::string::string((string *)local_40,"results",&local_42);
  this_02 = &this->field_0x108;
  lVar3 = 0;
  do {
    std::ofstream::ofstream(this_02);
    lVar3 = lVar3 + -0x200;
    this_02 = (void *)((long)this_02 + 0x200);
  } while (lVar3 != -0x800);
  Create(this,has_sled,fixed);
  iVar2 = (**(code **)(*(long *)system + 0x178))(system);
  if (iVar2 == 0) {
    this_01 = (ContactMaterial *)operator_new(0x10);
    ContactMaterial::ContactMaterial(this_01,this);
    this->m_material_override = this_01;
  }
  return;
}

Assistant:

RoboSimian::RoboSimian(ChSystem* system, bool has_sled, bool fixed)
    : m_owns_system(false),
      m_system(system),
      m_wheel_mode(ActuationMode::SPEED),
      m_contact_reporter(new ContactManager),
      m_material_override(nullptr),
      m_sled_friction(0.8f),
      m_wheel_friction(0.8f),
      m_outdir(""),
      m_root("results") {
    Create(has_sled, fixed);

    //// TODO: currently, only NSC multicore systems support user override of composite materials
    if (system->GetContactMethod() == ChContactMethod::NSC) {
        m_material_override = new ContactMaterial(this);
    }
}